

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

void __thiscall
duckdb::CardinalityEstimator::InitCardinalityEstimatorProps
          (CardinalityEstimator *this,optional_ptr<duckdb::JoinRelationSet,_true> set,
          RelationStats *stats)

{
  __normal_iterator<duckdb::RelationsToTDom_*,_std::vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>_>
  __first;
  __normal_iterator<duckdb::RelationsToTDom_*,_std::vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>_>
  __last;
  long lVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  CardinalityHelper card_helper;
  optional_ptr<duckdb::JoinRelationSet,_true> local_88;
  string local_80;
  double local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_60 = ((double)CONCAT44(0x45300000,(int)(stats->cardinality >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)stats->cardinality) - 4503599627370496.0);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_88.ptr = set.ptr;
  optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&local_88);
  JoinRelationSet::ToString_abi_cxx11_(&local_80,local_88.ptr);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->relation_set_2_cardinality,&local_80);
  pmVar2->cardinality_before_filters = local_60;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pmVar2->table_names_joined,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pmVar2->column_names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&uStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  UpdateTotalDomains(this,local_88,stats);
  __first._M_current =
       (this->relations_to_tdoms).
       super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
       super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>._M_impl
       .super__Vector_impl_data._M_start;
  __last._M_current =
       (this->relations_to_tdoms).
       super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
       super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar3 = (long)__last._M_current - (long)__first._M_current >> 7;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::RelationsToTDom*,std::vector<duckdb::RelationsToTDom,std::allocator<duckdb::RelationsToTDom>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(duckdb::RelationsToTDom_const&,duckdb::RelationsToTDom_const&)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_duckdb::RelationsToTDom_&,_const_duckdb::RelationsToTDom_&)>
                )SortTdoms);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::RelationsToTDom*,std::vector<duckdb::RelationsToTDom,std::allocator<duckdb::RelationsToTDom>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(duckdb::RelationsToTDom_const&,duckdb::RelationsToTDom_const&)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_duckdb::RelationsToTDom_&,_const_duckdb::RelationsToTDom_&)>
                )SortTdoms);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&uStack_40);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  return;
}

Assistant:

void CardinalityEstimator::InitCardinalityEstimatorProps(optional_ptr<JoinRelationSet> set, RelationStats &stats) {
	// Get the join relation set
	D_ASSERT(stats.stats_initialized);
	auto relation_cardinality = stats.cardinality;

	auto card_helper = CardinalityHelper((double)relation_cardinality);
	relation_set_2_cardinality[set->ToString()] = card_helper;

	UpdateTotalDomains(set, stats);

	// sort relations from greatest tdom to lowest tdom.
	std::sort(relations_to_tdoms.begin(), relations_to_tdoms.end(), SortTdoms);
}